

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::HttpHeaders_const&>(String *__return_storage_ptr__,kj *this,HttpHeaders *params)

{
  String local_28;
  
  HttpHeaders::serialize
            (&local_28,(HttpHeaders *)this,(ArrayPtr<const_char>)ZEXT816(0),
             (ArrayPtr<const_char>)ZEXT816(0),(ArrayPtr<const_char>)ZEXT816(0),
             (ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
  (__return_storage_ptr__->content).ptr = local_28.content.ptr;
  (__return_storage_ptr__->content).size_ = local_28.content.size_;
  (__return_storage_ptr__->content).disposer = local_28.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}